

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5FlushSecureDelete(Fts5Index *p,Fts5Structure *pStruct,char *zTerm,int nTerm,i64 iRowid)

{
  int *pRc;
  uint iSegid;
  Fts5Config *pFVar1;
  ushort *pData;
  Fts5StructureSegment *pFVar2;
  ushort *pData_00;
  u8 *puVar3;
  bool bVar4;
  bool bVar5;
  Fts5Iter *pFVar6;
  sqlite3_stmt *pStmt_00;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *zSql;
  void *__dest;
  Fts5Data *pFVar13;
  ushort uVar14;
  ulong uVar15;
  size_t __n;
  long lVar16;
  uint uVar17;
  uint uVar18;
  Fts5Config *pConfig;
  long lVar19;
  int iVar20;
  uint uVar21;
  u8 *__src;
  int iKeyOff;
  int iVar22;
  uint uVar23;
  int iVar24;
  Fts5SegIter *pFVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  long in_FS_OFFSET;
  bool bVar31;
  int local_f4;
  uchar *local_a8;
  int local_70;
  Fts5Iter *pIter;
  int nSuffix2;
  int nPrefix2;
  int nPos;
  undefined4 uStack_4c;
  sqlite3_stmt *pStmt;
  int nSuffix;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter = (Fts5Iter *)0x0;
  pFVar1 = p->pConfig;
  if (pFVar1->iVersion != 5) {
    pStmt = (sqlite3_stmt *)0x0;
    zSql = sqlite3_mprintf("REPLACE INTO %Q.\'%q_config\' VALUES (\'version\', %d)",pFVar1->zDb,
                           pFVar1->zName);
    fts5IndexPrepareStmt(p,&pStmt,zSql);
    pStmt_00 = pStmt;
    if (p->rc == 0) {
      sqlite3_step(pStmt);
      iVar8 = sqlite3_finalize(pStmt_00);
      if (p->rc == 0) {
        p->rc = iVar8;
      }
      pFVar1->iCookie = pFVar1->iCookie + 1;
      pFVar1->iVersion = 5;
    }
  }
  fts5MultiIterNew(p,pStruct,0x40,(Fts5Colset *)0x0,(u8 *)zTerm,nTerm,-1,0,&pIter);
  pFVar6 = pIter;
  pRc = &p->rc;
  if ((p->rc != 0) || ((pIter->base).bEof != '\0')) goto LAB_001e8d71;
  if (pIter->aSeg[pIter->aFirst[1].iFirst].iRowid < iRowid) {
    fts5MultiIterNextFrom(p,pIter,iRowid);
  }
  if (((*pRc != 0) || ((pFVar6->base).bEof != '\0')) ||
     (uVar14 = pFVar6->aFirst[1].iFirst, pFVar6->aSeg[uVar14].iRowid != iRowid)) goto LAB_001e8d71;
  iVar8 = p->pConfig->eDetail;
  pFVar13 = pFVar6->aSeg[uVar14].pLeaf;
  iSegid = (pFVar6->aSeg[uVar14].pSeg)->iSegid;
  pData = (ushort *)pFVar13->p;
  iVar24 = pFVar13->nn;
  uVar27 = pFVar13->szLeaf;
  pStmt = (sqlite3_stmt *)0x0;
  iVar20 = iVar24 - uVar27;
  __dest = sqlite3Fts5MallocZero(pRc,(long)(iVar20 + 0x10));
  if (p->rc != 0) goto LAB_001e8d71;
  pFVar25 = pFVar6->aSeg + uVar14;
  memcpy(__dest,(void *)((long)(int)uVar27 + (long)pData),(long)iVar20);
  iVar22 = pFVar25->iLeafPgno;
  lVar28 = (long)iVar22;
  if (iVar22 == pFVar25->iTermLeafPgno) {
    uVar21 = pFVar25->iTermLeafOffset;
  }
  else {
    uVar21 = (uint)(ushort)(*pData << 8 | *pData >> 8);
  }
  bVar7 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar21),(u64 *)&pStmt);
  uVar17 = uVar21 + bVar7;
  lVar26 = (long)(int)uVar17;
  if (iVar8 == 1) {
    lVar16 = pFVar25->iLeafOffset;
    while (lVar26 < lVar16) {
      bVar31 = *(char *)((long)pData + lVar26) == '\0';
      uVar21 = uVar17 + bVar31 +
               (uint)(*(char *)((long)pData + (long)(int)(bVar31 + uVar17)) == '\0');
      bVar7 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar21),(u64 *)&pStmt);
      uVar17 = uVar21 + bVar7;
      lVar26 = (long)(int)uVar17;
    }
    if ((int)uVar17 < pFVar25->iEndofDoclist) {
      uVar17 = uVar17 + (*(char *)((long)pData + lVar26) == '\0');
    }
    if ((int)uVar17 < pFVar25->iEndofDoclist) {
      uVar17 = uVar17 + (*(char *)((long)pData + (long)(int)uVar17) == '\0');
    }
  }
  else {
    _nPos = _nPos & 0xffffffff00000000;
    iVar8 = sqlite3Fts5GetVarint32((uchar *)((long)pData + lVar26),(u32 *)&nPos);
    lVar26 = pFVar25->iLeafOffset;
    for (iVar8 = uVar17 + iVar8; iVar8 < lVar26; iVar8 = uVar21 + bVar7 + iVar8) {
      uVar21 = nPos / 2 + iVar8;
      bVar7 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar21),(u64 *)&pStmt);
      iVar8 = sqlite3Fts5GetVarint32
                        ((uchar *)((long)pData + (long)(int)(uVar21 + bVar7)),(u32 *)&nPos);
    }
    uVar17 = (int)lVar26 + pFVar25->nPos;
  }
  bVar31 = false;
  if ((int)uVar27 <= (int)uVar17) {
    bVar31 = true;
    if ((p->rc == 0) && (pFVar2 = pFVar25->pSeg, iVar22 < pFVar2->pgnoLast)) {
      iVar8 = p->pConfig->eDetail;
      bVar31 = true;
      do {
        lVar28 = lVar28 + 1;
        lVar26 = ((ulong)(uint)pFVar2->iSegid << 0x25) + lVar28;
        _nPos = _nPos & 0xffffffff00000000;
        pFVar13 = fts5DataRead(p,lVar26);
        if (pFVar13 == (Fts5Data *)0x0) {
          pFVar13 = (Fts5Data *)0x0;
          bVar5 = true;
        }
        else {
          pData_00 = (ushort *)pFVar13->p;
          uVar14 = *pData_00 << 8 | *pData_00 >> 8;
          _nPos = CONCAT44(uStack_4c,(uint)uVar14);
          bVar5 = false;
          if ((uVar14 == 0) && (bVar5 = bVar31, pFVar13->szLeaf != pFVar13->nn)) {
            sqlite3Fts5GetVarint32((uchar *)((long)pFVar13->szLeaf + (long)pData_00),(u32 *)&nPos);
          }
          bVar31 = bVar5;
          iVar22 = nPos;
          uVar15 = _nPos & 0xffffffff;
          if (uVar15 == 0) {
            nSuffix = 0x4000000;
            if (iVar8 != 1) {
              fts5DataWrite(p,lVar26,(u8 *)&nSuffix,4);
            }
            sqlite3_free(pFVar13);
            pFVar13 = (Fts5Data *)0x0;
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (iVar8 != 1) {
              iVar10 = pFVar13->szLeaf;
              if (((nPos < iVar10) && (3 < nPos)) && (iVar12 = pFVar13->nn, iVar10 <= iVar12)) {
                lVar16 = (long)nPos + -4;
                if (iVar10 < iVar12) {
                  nSuffix = 0;
                  iVar9 = sqlite3Fts5GetVarint32
                                    ((uchar *)((long)pData_00 + (long)iVar10),(u32 *)&nSuffix);
                  iVar11 = nSuffix;
                  if (nSuffix < iVar22) {
                    *pRc = 0x10b;
LAB_001e85c9:
                    bVar4 = false;
                    bVar5 = true;
                    uVar17 = 0;
                    local_a8 = (uchar *)0x0;
                  }
                  else {
                    local_a8 = (uchar *)sqlite3Fts5MallocZero(pRc,(long)((iVar12 - iVar10) + 2));
                    if (local_a8 == (uchar *)0x0) goto LAB_001e85c9;
                    iVar9 = iVar9 + iVar10;
                    local_70 = (int)lVar16;
                    uVar17 = sqlite3Fts5PutVarint(local_a8,(long)(iVar11 - local_70));
                    bVar5 = false;
                    bVar4 = true;
                    iVar22 = pFVar13->nn - iVar9;
                    if (iVar22 != 0 && iVar9 <= pFVar13->nn) {
                      memcpy(local_a8 + (int)uVar17,(void *)((long)iVar9 + (long)pData_00),
                             (long)iVar22);
                      uVar17 = (uVar17 - iVar9) + pFVar13->nn;
                    }
                  }
                  if (!bVar4) goto LAB_001e84fb;
                }
                else {
                  uVar17 = 0;
                  local_a8 = (uchar *)0x0;
                }
                lVar19 = pFVar13->szLeaf - lVar16;
                memmove(pData_00 + 2,(void *)(uVar15 + (long)pData_00),
                        (pFVar13->szLeaf - lVar16) - 4);
                iVar22 = (int)lVar19;
                uVar14 = (ushort)lVar19;
                pData_00[1] = uVar14 << 8 | uVar14 >> 8;
                if (*(char *)((long)pData_00 + 1) != '\0' || (char)*pData_00 != '\0') {
                  *pData_00 = 0x400;
                }
                if (0 < (int)uVar17) {
                  memcpy((void *)((long)pData_00 + (long)iVar22),local_a8,(ulong)uVar17);
                  iVar22 = iVar22 + uVar17;
                }
                sqlite3_free(local_a8);
                fts5DataWrite(p,lVar26,(u8 *)pData_00,iVar22);
                bVar5 = true;
              }
              else {
                *pRc = 0x10b;
                bVar5 = true;
              }
            }
          }
        }
LAB_001e84fb:
      } while (((!bVar5) && (*pRc == 0)) && (lVar28 < pFVar2->pgnoLast));
    }
    else {
      pFVar13 = (Fts5Data *)0x0;
    }
    sqlite3_free(pFVar13);
    uVar17 = uVar27;
  }
  if (pFVar25->bDel == '\0') {
    if ((0 < iVar20) && (uVar17 != uVar27)) {
      uVar18 = 0;
      uVar23 = 0;
      do {
        _nPos = _nPos & 0xffffffff00000000;
        iVar8 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar18 + (long)__dest),(u32 *)&nPos);
        uVar18 = uVar18 + iVar8;
        uVar23 = uVar23 + nPos;
        if (uVar23 == uVar17) {
          bVar31 = true;
        }
      } while ((int)uVar18 < iVar20);
    }
    if ((uVar21 == (ushort)(*pData << 8 | *pData >> 8)) && (uVar17 == uVar27 || bVar31)) {
      *pData = 0;
    }
  }
  if (pFVar25->bDel == '\0') {
    if (bVar31) {
      lVar28 = (long)pFVar25->iLeafPgno;
      if ((pFVar25->iLeafPgno == pFVar25->iTermLeafPgno) && (uVar21 == pFVar25->iTermLeafOffset)) {
        if (iVar20 < 1) {
          bVar31 = false;
          uVar21 = 0;
        }
        else {
          uVar15 = 0;
          iVar8 = 0;
          uVar18 = 0;
          do {
            _nPos = _nPos & 0xffffffff00000000;
            iVar22 = sqlite3Fts5GetVarint32((uchar *)(uVar15 + (long)__dest),(u32 *)&nPos);
            uVar23 = nPos + uVar18;
            if (uVar21 < uVar23) break;
            uVar29 = (int)uVar15 + iVar22;
            uVar15 = (ulong)uVar29;
            iVar8 = iVar8 + 1;
            uVar18 = uVar23;
          } while ((int)uVar29 < iVar20);
          uVar21 = uVar18;
          bVar31 = iVar8 == 1;
        }
        uVar18 = uVar21;
        if (uVar17 != uVar27) {
          _nPos = _nPos & 0xffffffff00000000;
          nSuffix = 0;
          nPrefix2 = 0;
          nSuffix2 = 0;
          iVar8 = sqlite3Fts5GetVarint32
                            ((uchar *)((long)(int)uVar17 + (long)pData),(u32 *)&nPrefix2);
          iVar22 = sqlite3Fts5GetVarint32
                             ((uchar *)((long)(int)(iVar8 + uVar17) + (long)pData),(u32 *)&nSuffix2)
          ;
          uVar23 = uVar21;
          if (!bVar31) {
            iVar10 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar21 + (long)pData),(u32 *)&nPos)
            ;
            uVar23 = iVar10 + uVar21;
          }
          uVar29 = iVar8 + uVar17 + iVar22;
          iVar11 = sqlite3Fts5GetVarint32
                             ((uchar *)((long)pData + (long)(int)uVar23),(u32 *)&nSuffix);
          iVar22 = nPrefix2;
          iVar8 = nSuffix2;
          iVar10 = nPos;
          iVar12 = nPrefix2;
          if (nPos < nPrefix2) {
            iVar12 = nPos;
          }
          _nPos = CONCAT44(uStack_4c,iVar12);
          __n = (size_t)nSuffix2;
          iVar9 = nPrefix2 - iVar12;
          iVar30 = iVar9 + nSuffix2;
          nSuffix = iVar30;
          uVar18 = uVar17;
          if (((int)uVar27 < (int)(uVar23 + iVar30 + iVar11)) ||
             (uVar17 = nSuffix2 + uVar29, (int)uVar27 < (int)uVar17)) {
            *pRc = 0x10b;
            uVar17 = uVar29;
          }
          else {
            if (!bVar31) {
              iVar11 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar21 + (long)pData),(long)iVar12)
              ;
              uVar21 = uVar21 + iVar11;
            }
            iVar11 = sqlite3Fts5PutVarint((uchar *)((long)pData + (long)(int)uVar21),(long)iVar30);
            iVar11 = uVar21 + iVar11;
            if ((pFVar25->term).n < iVar22) {
              *pRc = 0x10b;
            }
            else if (iVar10 < iVar22) {
              memcpy((void *)((long)pData + (long)iVar11),(pFVar25->term).p + iVar12,(long)iVar9);
              iVar11 = iVar11 + iVar9;
            }
            memmove((void *)((long)pData + (long)iVar11),(void *)((long)(int)uVar29 + (long)pData),
                    __n);
            uVar21 = iVar11 + iVar8;
          }
        }
      }
      else {
        if (uVar21 != 4) goto LAB_001e88d6;
        lVar26 = (ulong)iSegid << 0x25;
        do {
          lVar28 = lVar28 + -1;
          if (lVar28 <= pFVar25->iTermLeafPgno) break;
          pFVar13 = fts5DataRead(p,lVar28 + lVar26);
          if (pFVar13 == (Fts5Data *)0x0) {
            sqlite3_free((void *)0x0);
            break;
          }
          iVar8 = pFVar13->nn;
          sqlite3_free(pFVar13);
        } while (iVar8 == 4);
        if (pFVar25->iTermLeafPgno == (int)lVar28) {
          lVar26 = lVar26 + pFVar25->iTermLeafPgno;
          pFVar13 = fts5DataRead(p,lVar26);
          if (pFVar13 != (Fts5Data *)0x0) {
            iVar8 = pFVar13->szLeaf;
            if (iVar8 == pFVar25->iTermLeafOffset) {
              puVar3 = pFVar13->p;
              __src = puVar3 + iVar8;
              iVar22 = pFVar13->nn;
              iVar12 = 0;
              iVar10 = 0;
              do {
                iVar11 = iVar10;
                _nPos = _nPos & 0xffffffff00000000;
                iVar9 = sqlite3Fts5GetVarint32(__src + iVar11,(u32 *)&nPos);
                iVar12 = iVar12 + nPos;
                iVar10 = iVar9 + iVar11;
              } while (iVar9 + iVar11 < iVar22 - iVar8);
              memmove(puVar3 + iVar12,__src,(long)iVar11);
              *(ushort *)(pFVar13->p + 2) = (ushort)iVar12 << 8 | (ushort)iVar12 >> 8;
              fts5DataWrite(p,lVar26,pFVar13->p,iVar12 + iVar11);
              if (iVar11 == 0) {
                fts5SecureDeleteIdxEntry(p,iSegid,pFVar25->iTermLeafPgno);
              }
            }
          }
          sqlite3_free(pFVar13);
        }
        uVar21 = 4;
        uVar18 = 0;
      }
    }
    else if (uVar17 == uVar27) {
LAB_001e88d6:
      uVar18 = 0;
    }
    else {
      _nPos = 0;
      bVar7 = sqlite3Fts5GetVarint((uchar *)((long)(int)uVar17 + (long)pData),(u64 *)&nPos);
      iVar8 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar21 + (long)pData),(u64)(pStmt + _nPos));
      uVar21 = iVar8 + uVar21;
      uVar17 = bVar7 + uVar17;
      uVar18 = 0;
    }
  }
  else {
    iVar8 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar21 + (long)pData),(u64)pStmt);
    iVar22 = iVar8 + uVar21;
    uVar21 = uVar21 + iVar8 + 1;
    *(undefined1 *)((long)pData + (long)iVar22) = 1;
    uVar18 = 0;
  }
  if (*pRc == 0) {
    memmove((void *)((long)(int)uVar21 + (long)pData),(void *)((long)(int)uVar17 + (long)pData),
            (long)(int)(iVar24 - uVar17));
    iVar24 = uVar27 - (uVar17 - uVar21);
    pData[1] = (ushort)iVar24 << 8 | (ushort)iVar24 >> 8;
    iVar8 = iVar24;
    if (0 < iVar20) {
      uVar27 = 0;
      local_f4 = 0;
      uVar15 = 0;
      do {
        _nPos = _nPos & 0xffffffff00000000;
        iVar22 = sqlite3Fts5GetVarint32((uchar *)(uVar15 + (long)__dest),(u32 *)&nPos);
        uVar27 = uVar27 + nPos;
        if (uVar27 != uVar18) {
          iVar10 = 0;
          if ((int)uVar21 < (int)uVar27) {
            iVar10 = uVar17 - uVar21;
          }
          iVar12 = sqlite3Fts5PutVarint
                             ((uchar *)((long)pData + (long)iVar8),
                              (long)(int)((uVar27 - iVar10) - local_f4));
          iVar8 = iVar8 + iVar12;
          local_f4 = uVar27 - iVar10;
        }
        uVar23 = (int)uVar15 + iVar22;
        uVar15 = (ulong)uVar23;
      } while ((int)uVar23 < iVar20);
    }
    if (((0 < iVar20) && (iVar24 == iVar8)) && (pFVar25->iLeafPgno != 1)) {
      fts5SecureDeleteIdxEntry(p,iSegid,pFVar25->iLeafPgno);
    }
    fts5DataWrite(p,(long)pFVar25->iLeafPgno + ((ulong)iSegid << 0x25),(u8 *)pData,iVar8);
  }
  sqlite3_free(__dest);
LAB_001e8d71:
  fts5MultiIterFree(pIter);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *pRc;
}

Assistant:

static int fts5FlushSecureDelete(
  Fts5Index *p,
  Fts5Structure *pStruct,
  const char *zTerm,
  int nTerm,
  i64 iRowid
){
  const int f = FTS5INDEX_QUERY_SKIPHASH;
  Fts5Iter *pIter = 0;            /* Used to find term instance */

  /* If the version number has not been set to SECUREDELETE, do so now. */
  if( p->pConfig->iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE ){
    Fts5Config *pConfig = p->pConfig;
    sqlite3_stmt *pStmt = 0;
    fts5IndexPrepareStmt(p, &pStmt, sqlite3_mprintf(
          "REPLACE INTO %Q.'%q_config' VALUES ('version', %d)",
          pConfig->zDb, pConfig->zName, FTS5_CURRENT_VERSION_SECUREDELETE
    ));
    if( p->rc==SQLITE_OK ){
      int rc;
      sqlite3_step(pStmt);
      rc = sqlite3_finalize(pStmt);
      if( p->rc==SQLITE_OK ) p->rc = rc;
      pConfig->iCookie++;
      pConfig->iVersion = FTS5_CURRENT_VERSION_SECUREDELETE;
    }
  }

  fts5MultiIterNew(p, pStruct, f, 0, (const u8*)zTerm, nTerm, -1, 0, &pIter);
  if( fts5MultiIterEof(p, pIter)==0 ){
    i64 iThis = fts5MultiIterRowid(pIter);
    if( iThis<iRowid ){
      fts5MultiIterNextFrom(p, pIter, iRowid);
    }

    if( p->rc==SQLITE_OK
     && fts5MultiIterEof(p, pIter)==0
     && iRowid==fts5MultiIterRowid(pIter)
    ){
      Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      fts5DoSecureDelete(p, pSeg);
    }
  }

  fts5MultiIterFree(pIter);
  return p->rc;
}